

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

uchar anon_unknown.dwarf_6f1cc::ParseEscapeSequence
                (ExpressionContext *ctx,SynBase *source,char *str)

{
  char cVar1;
  char *str_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  if (*str == '\\') {
    cVar1 = str[1];
    if (cVar1 == '\"') {
      ctx_local._7_1_ = '\"';
    }
    else if (cVar1 == '\'') {
      ctx_local._7_1_ = '\'';
    }
    else if (cVar1 == '0') {
      ctx_local._7_1_ = '\0';
    }
    else if (cVar1 == '\\') {
      ctx_local._7_1_ = '\\';
    }
    else if (cVar1 == 'n') {
      ctx_local._7_1_ = '\n';
    }
    else if (cVar1 == 'r') {
      ctx_local._7_1_ = '\r';
    }
    else if (cVar1 == 't') {
      ctx_local._7_1_ = '\t';
    }
    else {
      ReportAt(ctx,source,str,"ERROR: unknown escape sequence");
      ctx_local._7_1_ = '\0';
    }
    return ctx_local._7_1_;
  }
  __assert_fail("str[0] == \'\\\\\'",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0xc2,
                "unsigned char (anonymous namespace)::ParseEscapeSequence(ExpressionContext &, SynBase *, const char *)"
               );
}

Assistant:

unsigned char ParseEscapeSequence(ExpressionContext &ctx, SynBase *source, const char* str)
	{
		assert(str[0] == '\\');

		switch(str[1])
		{
		case 'n':
			return '\n';
		case 'r':
			return '\r';
		case 't':
			return '\t';
		case '0':
			return '\0';
		case '\'':
			return '\'';
		case '\"':
			return '\"';
		case '\\':
			return '\\';
		}

		ReportAt(ctx, source, str, "ERROR: unknown escape sequence");

		return 0;
	}